

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStream.cpp
# Opt level: O3

void __thiscall
DIS::DataStream::DataStream(DataStream *this,char *buffer,size_t length,Endian stream)

{
  (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_read_pos = 0;
  (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->_write_pos = 0;
  this->_stream_endian = stream;
  this->_machine_endian = LITTLE;
  SetStream(this,buffer,length,stream);
  return;
}

Assistant:

DataStream::DataStream(const char* buffer, size_t length, Endian stream)
   : _buffer()
   , _read_pos(0)
   , _write_pos(0)
   , _stream_endian(stream)
   , _machine_endian(LITTLE)
{
   long one(1);
   char e = (reinterpret_cast<char*>( &one ))[0];

   if( e == (char)1 )
   {
      _machine_endian = LITTLE;
   }
   else
   {
      _machine_endian = BIG;
   }

   SetStream( buffer, length, stream );
}